

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O0

void xPredIntraAngAdi_X_8(pel *pSrc,pel *dst,int i_dst,int uiDirMode,int iWidth,int iHeight)

{
  undefined1 uVar1;
  undefined1 uVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int local_118;
  int pad2;
  int pad1;
  pel *pfirst [2];
  int aligned_line_size;
  int i;
  int real_size;
  int line_size;
  pel first_line [192];
  int iHeight_local;
  int iWidth_local;
  int uiDirMode_local;
  int i_dst_local;
  pel *dst_local;
  pel *pSrc_local;
  
  iVar4 = iWidth + iHeight / 2;
  iVar5 = iVar4 + -1;
  local_118 = iVar5;
  if (iWidth * 2 + 1 <= iVar5) {
    local_118 = iWidth * 2 + 1;
  }
  lVar3 = (long)((iVar4 + 0xe >> 4) << 4) + -0xe8;
  dst_local = pSrc;
  for (pfirst[1]._4_4_ = 0; pfirst[1]._4_4_ < local_118; pfirst[1]._4_4_ = pfirst[1]._4_4_ + 1) {
    *(char *)((long)&real_size + (long)pfirst[1]._4_4_) =
         (char)((int)((uint)*dst_local + ((uint)dst_local[1] + (uint)dst_local[2]) * 3 +
                      (uint)dst_local[3] + 4) >> 3);
    *(char *)((long)&real_size + pfirst[1]._4_4_ + lVar3 + 0xe8) =
         (char)((int)((uint)dst_local[1] + (uint)dst_local[2] * 2 + (uint)dst_local[3] + 2) >> 2);
    dst_local = dst_local + 1;
  }
  if (local_118 < iVar5) {
    *(undefined1 *)((long)&real_size + (local_118 + -1) + lVar3 + 0xe8) =
         *(undefined1 *)((long)&real_size + (local_118 + -2) + lVar3 + 0xe8);
    uVar1 = *(undefined1 *)((long)&real_size + (long)(local_118 + -1));
    uVar2 = *(undefined1 *)((long)&real_size + (local_118 + -1) + lVar3 + 0xe8);
    for (; pfirst[1]._4_4_ < iVar5; pfirst[1]._4_4_ = pfirst[1]._4_4_ + 1) {
      *(undefined1 *)((long)&real_size + (long)pfirst[1]._4_4_) = uVar1;
      *(undefined1 *)((long)&real_size + pfirst[1]._4_4_ + lVar3 + 0xe8) = uVar2;
    }
  }
  first_line._184_4_ = iHeight / 2;
  first_line._188_4_ = iWidth;
  _uiDirMode_local = dst;
  for (pfirst[1]._4_4_ = 0; pfirst[1]._4_4_ < (int)first_line._184_4_;
      pfirst[1]._4_4_ = pfirst[1]._4_4_ + 1) {
    memcpy(_uiDirMode_local,(void *)((long)&real_size + (long)pfirst[1]._4_4_),
           (long)(int)first_line._188_4_);
    memcpy(_uiDirMode_local + i_dst,(void *)((long)&real_size + pfirst[1]._4_4_ + lVar3 + 0xe8),
           (long)(int)first_line._188_4_);
    _uiDirMode_local = _uiDirMode_local + (i_dst << 1);
  }
  return;
}

Assistant:

static void xPredIntraAngAdi_X_8(pel *pSrc, pel *dst, int i_dst, int uiDirMode, int iWidth, int iHeight)
{
    ALIGNED_16(pel first_line[2 * (64 + 32)]);
    int line_size = iWidth + iHeight / 2 - 1;
    int real_size = min(line_size, iWidth * 2 + 1);
    int i;
    int aligned_line_size = ((line_size + 15) >> 4) << 4;
    pel *pfirst[2] = { first_line, first_line + aligned_line_size };

    for (i = 0; i < real_size; i++, pSrc++) {
        pfirst[0][i] = (pSrc[0] + (pSrc[1] + pSrc[2]) * 3 + pSrc[3] + 4) >> 3;
        pfirst[1][i] = (pSrc[1] + pSrc[2] * 2 + pSrc[3] + 2) >> 2;
    }

    // padding
    if (real_size < line_size) {
        int pad1, pad2;

        pfirst[1][real_size - 1] = pfirst[1][real_size - 2];

        pad1 = pfirst[0][real_size - 1];
        pad2 = pfirst[1][real_size - 1];
        for (; i < line_size; i++) {
            pfirst[0][i] = pad1;
            pfirst[1][i] = pad2;
        }
    }

    iHeight /= 2;

    for (i = 0; i < iHeight; i++) {
        memcpy(dst, pfirst[0] + i, iWidth * sizeof(pel));
        memcpy(dst + i_dst, pfirst[1] + i, iWidth * sizeof(pel));
        dst += i_dst * 2;
    }
}